

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_triangle_mesh.h
# Opt level: O1

PrimInfo * __thiscall
embree::avx::TriangleMeshISA::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,TriangleMeshISA *this,PrimRef *prims,BBox1f *time_range,
          range<unsigned_long> *r,size_t k,uint geomID)

{
  float fVar1;
  BBox1f BVar2;
  BufferView<embree::Vec3fa> *pBVar3;
  bool bVar4;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  float fVar7;
  size_t *psVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  char *pcVar13;
  long lVar14;
  size_t sVar15;
  long lVar16;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  undefined4 uVar23;
  float fVar24;
  float fVar25;
  float fVar29;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar55 [16];
  float fVar30;
  undefined1 extraout_var [56];
  float fVar31;
  float fVar34;
  float fVar35;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float fVar43;
  float fVar44;
  undefined1 auVar42 [16];
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar51;
  float fVar52;
  undefined1 auVar50 [16];
  float fVar53;
  undefined1 auVar54 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar56;
  undefined1 auVar57 [64];
  float fVar58;
  float fVar59;
  size_t local_b8;
  size_t local_b0;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  float fVar8;
  
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[3] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[3] = -INFINITY;
  __return_storage_ptr__->begin = SUB168(ZEXT816(0) << 0x20,0);
  __return_storage_ptr__->end = SUB168(ZEXT816(0) << 0x20,8);
  auVar57._0_8_ = Geometry::getTimeRange((Geometry *)this);
  auVar57._8_56_ = extraout_var;
  auVar32._8_8_ = 0;
  auVar32._0_4_ = time_range->lower;
  auVar32._4_4_ = time_range->upper;
  auVar26 = auVar57._0_16_;
  auVar40 = vcmpps_avx(auVar26,auVar32,1);
  auVar27 = vblendps_avx(auVar32,auVar26,2);
  auVar26 = vinsertps_avx(auVar26,auVar32,0x50);
  auVar27 = vblendvps_avx(auVar26,auVar27,auVar40);
  auVar40 = vmovshdup_avx(auVar27);
  fVar24 = auVar27._0_4_;
  fVar31 = auVar40._0_4_;
  if (fVar24 <= fVar31) {
    uVar10 = r->_begin;
    aVar56 = (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             lower.field_0;
    auVar57 = ZEXT1664((undefined1  [16])aVar56);
    local_78 = *(undefined1 (*) [16])
                (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
                upper.field_0.m128;
    local_88 = *(undefined1 (*) [16])
                (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
                lower.field_0.m128;
    local_98 = *(undefined1 (*) [16])
                (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
                upper.field_0.m128;
    local_b8 = __return_storage_ptr__->end;
    if (uVar10 < r->_end) {
      auVar54 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
      local_b0 = k;
      do {
        auVar26._8_4_ = 0x5dccb9a2;
        auVar26._0_8_ = 0x5dccb9a25dccb9a2;
        auVar40._8_4_ = 0xddccb9a2;
        auVar40._0_8_ = 0xddccb9a2ddccb9a2;
        auVar26._12_4_ = 0x5dccb9a2;
        auVar40._12_4_ = 0xddccb9a2;
        BVar2 = (this->super_TriangleMesh).super_Geometry.time_range;
        auVar27._8_8_ = 0;
        auVar27._0_4_ = BVar2.lower;
        auVar27._4_4_ = BVar2.upper;
        fVar1 = (this->super_TriangleMesh).super_Geometry.fnumTimeSegments;
        auVar27 = vmovshdup_avx(auVar27);
        fVar25 = BVar2.lower;
        fVar29 = auVar27._0_4_ - fVar25;
        lVar14 = *(long *)&(this->super_TriangleMesh).super_Geometry.field_0x58;
        lVar12 = *(long *)&(this->super_TriangleMesh).field_0x68 * uVar10;
        uVar19 = (ulong)*(uint *)(lVar14 + lVar12);
        pBVar3 = (this->super_TriangleMesh).vertices.items;
        uVar22 = (pBVar3->super_RawBufferView).num;
        if (((uVar19 < uVar22) && (uVar20 = (ulong)*(uint *)(lVar14 + 4 + lVar12), uVar20 < uVar22))
           && (uVar21 = (ulong)*(uint *)(lVar14 + 8 + lVar12), uVar21 < uVar22)) {
          auVar27 = ZEXT416((uint)(fVar1 * ((fVar24 - fVar25) / fVar29) * 1.0000002));
          auVar27 = vroundss_avx(auVar27,auVar27,9);
          auVar27 = vmaxss_avx(ZEXT816(0) << 0x40,auVar27);
          uVar11 = (uint)auVar27._0_4_;
          auVar27 = ZEXT416((uint)(fVar1 * ((fVar31 - fVar25) / fVar29) * 0.99999976));
          auVar27 = vroundss_avx(auVar27,auVar27,10);
          auVar27 = vminss_avx(auVar27,ZEXT416((uint)fVar1));
          uVar17 = (uint)auVar27._0_4_;
          bVar4 = uVar17 < uVar11;
          if (uVar11 <= uVar17) {
            uVar22 = (ulong)(int)uVar11;
            pcVar13 = pBVar3[uVar22].super_RawBufferView.ptr_ofs;
            sVar15 = pBVar3[uVar22].super_RawBufferView.stride;
            auVar27 = vcmpps_avx(*(undefined1 (*) [16])(pcVar13 + sVar15 * uVar19),auVar40,6);
            auVar32 = vcmpps_avx(*(undefined1 (*) [16])(pcVar13 + sVar15 * uVar19),auVar26,1);
            auVar27 = vandps_avx(auVar27,auVar32);
            uVar23 = vmovmskps_avx(auVar27);
            if ((~(byte)uVar23 & 7) == 0) {
              psVar9 = &pBVar3[uVar22 + 1].super_RawBufferView.stride;
              do {
                auVar27 = vcmpps_avx(*(undefined1 (*) [16])(pcVar13 + sVar15 * uVar20),auVar40,6);
                auVar32 = vcmpps_avx(*(undefined1 (*) [16])(pcVar13 + sVar15 * uVar20),auVar26,1);
                auVar27 = vandps_avx(auVar27,auVar32);
                uVar23 = vmovmskps_avx(auVar27);
                if ((~(byte)uVar23 & 7) != 0) break;
                auVar27 = vcmpps_avx(*(undefined1 (*) [16])(pcVar13 + sVar15 * uVar21),auVar40,6);
                auVar32 = vcmpps_avx(*(undefined1 (*) [16])(pcVar13 + sVar15 * uVar21),auVar26,1);
                auVar27 = vandps_avx(auVar27,auVar32);
                uVar23 = vmovmskps_avx(auVar27);
                if ((~(byte)uVar23 & 7) != 0) break;
                uVar22 = uVar22 + 1;
                bVar4 = (ulong)(long)(int)uVar17 < uVar22;
                if ((ulong)(long)(int)uVar17 < uVar22) break;
                pcVar13 = ((RawBufferView *)(psVar9 + -2))->ptr_ofs;
                sVar15 = *psVar9;
                psVar9 = psVar9 + 7;
                auVar27 = vcmpps_avx(*(undefined1 (*) [16])(pcVar13 + sVar15 * uVar19),auVar40,6);
                auVar32 = vcmpps_avx(*(undefined1 (*) [16])(pcVar13 + sVar15 * uVar19),auVar26,1);
                auVar27 = vandps_avx(auVar27,auVar32);
                uVar23 = vmovmskps_avx(auVar27);
              } while ((~(byte)uVar23 & 7) == 0);
            }
          }
        }
        else {
          bVar4 = false;
        }
        auVar33._8_4_ = -INFINITY;
        auVar33._0_8_ = 0xff800000ff800000;
        auVar33._12_4_ = -INFINITY;
        auVar42 = auVar54._0_16_;
        auVar50 = auVar33;
        auVar28 = auVar42;
        if (bVar4) {
          auVar55 = auVar57._0_16_;
          fVar29 = (this->super_TriangleMesh).super_Geometry.time_range.lower;
          fVar58 = (this->super_TriangleMesh).super_Geometry.time_range.upper - fVar29;
          fVar59 = (fVar24 - fVar29) / fVar58;
          fVar58 = (fVar31 - fVar29) / fVar58;
          fVar29 = fVar1 * fVar59;
          fVar25 = fVar1 * fVar58;
          auVar26 = vroundss_avx(ZEXT416((uint)fVar29),ZEXT416((uint)fVar29),9);
          auVar32 = vroundss_avx(ZEXT416((uint)fVar25),ZEXT416((uint)fVar25),10);
          auVar28 = ZEXT816(0) << 0x40;
          auVar27 = vmaxss_avx(auVar26,auVar28);
          auVar40 = vminss_avx(auVar32,ZEXT416((uint)fVar1));
          fVar30 = auVar40._0_4_;
          iVar18 = (int)auVar26._0_4_;
          if (iVar18 < 0) {
            iVar18 = -1;
          }
          uVar11 = (int)fVar1 + 1U;
          if ((int)auVar32._0_4_ < (int)((int)fVar1 + 1U)) {
            uVar11 = (int)auVar32._0_4_;
          }
          lVar12 = (long)(int)auVar27._0_4_;
          lVar16 = *(long *)&(this->super_TriangleMesh).field_0x68 * uVar10;
          uVar19 = (ulong)*(uint *)(lVar14 + lVar16);
          uVar20 = (ulong)*(uint *)(lVar14 + 4 + lVar16);
          pBVar3 = (this->super_TriangleMesh).vertices.items;
          pcVar13 = pBVar3[lVar12].super_RawBufferView.ptr_ofs;
          sVar15 = pBVar3[lVar12].super_RawBufferView.stride;
          uVar22 = (ulong)*(uint *)(lVar14 + 8 + lVar16);
          auVar40 = vminps_avx(*(undefined1 (*) [16])(pcVar13 + sVar15 * uVar19),
                               *(undefined1 (*) [16])(pcVar13 + sVar15 * uVar20));
          auVar32 = vminps_avx(auVar40,*(undefined1 (*) [16])(pcVar13 + sVar15 * uVar22));
          auVar40 = vmaxps_avx(*(undefined1 (*) [16])(pcVar13 + sVar15 * uVar19),
                               *(undefined1 (*) [16])(pcVar13 + sVar15 * uVar20));
          auVar40 = vmaxps_avx(auVar40,*(undefined1 (*) [16])(pcVar13 + sVar15 * uVar22));
          lVar14 = (long)(int)fVar30;
          pcVar13 = pBVar3[lVar14].super_RawBufferView.ptr_ofs;
          sVar15 = pBVar3[lVar14].super_RawBufferView.stride;
          auVar26 = vminps_avx(*(undefined1 (*) [16])(pcVar13 + sVar15 * uVar19),
                               *(undefined1 (*) [16])(pcVar13 + sVar15 * uVar20));
          auVar50 = vminps_avx(auVar26,*(undefined1 (*) [16])(pcVar13 + sVar15 * uVar22));
          auVar26 = vmaxps_avx(*(undefined1 (*) [16])(pcVar13 + sVar15 * uVar19),
                               *(undefined1 (*) [16])(pcVar13 + sVar15 * uVar20));
          auVar26 = vmaxps_avx(auVar26,*(undefined1 (*) [16])(pcVar13 + sVar15 * uVar22));
          auVar27 = ZEXT416((uint)(fVar29 - auVar27._0_4_));
          fVar46 = auVar26._0_4_;
          fVar47 = auVar26._4_4_;
          fVar48 = auVar26._8_4_;
          fVar49 = auVar26._12_4_;
          fVar43 = auVar50._4_4_;
          fVar45 = auVar50._8_4_;
          fVar7 = auVar50._12_4_;
          fVar44 = auVar32._4_4_;
          fVar52 = auVar32._8_4_;
          fVar53 = auVar32._12_4_;
          fVar36 = auVar40._4_4_;
          fVar51 = auVar40._8_4_;
          fVar8 = auVar40._12_4_;
          fVar29 = auVar32._0_4_;
          fVar34 = auVar40._0_4_;
          fVar35 = auVar50._0_4_;
          if (uVar11 - iVar18 == 1) {
            auVar27 = vmaxss_avx(auVar27,auVar28);
            auVar40 = vshufps_avx(auVar27,auVar27,0);
            auVar27 = ZEXT416((uint)(1.0 - auVar27._0_4_));
            auVar27 = vshufps_avx(auVar27,auVar27,0);
            auVar42._0_4_ = auVar27._0_4_ * fVar29 + auVar40._0_4_ * fVar35;
            auVar42._4_4_ = auVar27._4_4_ * fVar44 + auVar40._4_4_ * fVar43;
            auVar42._8_4_ = auVar27._8_4_ * fVar52 + auVar40._8_4_ * fVar45;
            auVar42._12_4_ = auVar27._12_4_ * fVar53 + auVar40._12_4_ * fVar7;
            auVar50._0_4_ = auVar27._0_4_ * fVar34 + fVar46 * auVar40._0_4_;
            auVar50._4_4_ = auVar27._4_4_ * fVar36 + fVar47 * auVar40._4_4_;
            auVar50._8_4_ = auVar27._8_4_ * fVar51 + fVar48 * auVar40._8_4_;
            auVar50._12_4_ = auVar27._12_4_ * fVar8 + fVar49 * auVar40._12_4_;
            auVar27 = vmaxss_avx(ZEXT416((uint)(fVar30 - fVar25)),auVar28);
            auVar40 = vshufps_avx(auVar27,auVar27,0);
            auVar27 = ZEXT416((uint)(1.0 - auVar27._0_4_));
            auVar27 = vshufps_avx(auVar27,auVar27,0);
            auVar28._0_4_ = auVar40._0_4_ * fVar29 + auVar27._0_4_ * fVar35;
            auVar28._4_4_ = auVar40._4_4_ * fVar44 + auVar27._4_4_ * fVar43;
            auVar28._8_4_ = auVar40._8_4_ * fVar52 + auVar27._8_4_ * fVar45;
            auVar28._12_4_ = auVar40._12_4_ * fVar53 + auVar27._12_4_ * fVar7;
            auVar33._0_4_ = auVar40._0_4_ * fVar34 + fVar46 * auVar27._0_4_;
            auVar33._4_4_ = auVar40._4_4_ * fVar36 + fVar47 * auVar27._4_4_;
            auVar33._8_4_ = auVar40._8_4_ * fVar51 + fVar48 * auVar27._8_4_;
            auVar33._12_4_ = auVar40._12_4_ * fVar8 + fVar49 * auVar27._12_4_;
            auVar57 = ZEXT1664(auVar55);
          }
          else {
            pcVar13 = pBVar3[lVar12 + 1].super_RawBufferView.ptr_ofs;
            sVar15 = pBVar3[lVar12 + 1].super_RawBufferView.stride;
            auVar40 = vminps_avx(*(undefined1 (*) [16])(pcVar13 + sVar15 * uVar19),
                                 *(undefined1 (*) [16])(pcVar13 + sVar15 * uVar20));
            auVar32 = vminps_avx(auVar40,*(undefined1 (*) [16])(pcVar13 + sVar15 * uVar22));
            auVar40 = vmaxps_avx(*(undefined1 (*) [16])(pcVar13 + sVar15 * uVar19),
                                 *(undefined1 (*) [16])(pcVar13 + sVar15 * uVar20));
            auVar40 = vmaxps_avx(auVar40,*(undefined1 (*) [16])(pcVar13 + sVar15 * uVar22));
            pcVar13 = pBVar3[lVar14 + -1].super_RawBufferView.ptr_ofs;
            sVar15 = pBVar3[lVar14 + -1].super_RawBufferView.stride;
            auVar26 = vminps_avx(*(undefined1 (*) [16])(pcVar13 + sVar15 * uVar19),
                                 *(undefined1 (*) [16])(pcVar13 + sVar15 * uVar20));
            auVar33 = vminps_avx(auVar26,*(undefined1 (*) [16])(pcVar13 + sVar15 * uVar22));
            auVar26 = vmaxps_avx(*(undefined1 (*) [16])(pcVar13 + sVar15 * uVar19),
                                 *(undefined1 (*) [16])(pcVar13 + sVar15 * uVar20));
            auVar26 = vmaxps_avx(auVar26,*(undefined1 (*) [16])(pcVar13 + sVar15 * uVar22));
            auVar27 = vmaxss_avx(auVar27,ZEXT416(0));
            auVar28 = vshufps_avx(auVar27,auVar27,0);
            auVar27 = ZEXT416((uint)(1.0 - auVar27._0_4_));
            auVar27 = vshufps_avx(auVar27,auVar27,0);
            auVar42._0_4_ = auVar27._0_4_ * fVar29 + auVar28._0_4_ * auVar32._0_4_;
            auVar42._4_4_ = auVar27._4_4_ * fVar44 + auVar28._4_4_ * auVar32._4_4_;
            auVar42._8_4_ = auVar27._8_4_ * fVar52 + auVar28._8_4_ * auVar32._8_4_;
            auVar42._12_4_ = auVar27._12_4_ * fVar53 + auVar28._12_4_ * auVar32._12_4_;
            auVar50._0_4_ = auVar27._0_4_ * fVar34 + auVar28._0_4_ * auVar40._0_4_;
            auVar50._4_4_ = auVar27._4_4_ * fVar36 + auVar28._4_4_ * auVar40._4_4_;
            auVar50._8_4_ = auVar27._8_4_ * fVar51 + auVar28._8_4_ * auVar40._8_4_;
            auVar50._12_4_ = auVar27._12_4_ * fVar8 + auVar28._12_4_ * auVar40._12_4_;
            auVar27 = vmaxss_avx(ZEXT416((uint)(fVar30 - fVar25)),ZEXT416(0));
            auVar40 = vshufps_avx(auVar27,auVar27,0);
            auVar27 = ZEXT416((uint)(1.0 - auVar27._0_4_));
            auVar27 = vshufps_avx(auVar27,auVar27,0);
            auVar28._0_4_ = auVar27._0_4_ * fVar35 + auVar40._0_4_ * auVar33._0_4_;
            auVar28._4_4_ = auVar27._4_4_ * fVar43 + auVar40._4_4_ * auVar33._4_4_;
            auVar28._8_4_ = auVar27._8_4_ * fVar45 + auVar40._8_4_ * auVar33._8_4_;
            auVar28._12_4_ = auVar27._12_4_ * fVar7 + auVar40._12_4_ * auVar33._12_4_;
            auVar33._0_4_ = fVar46 * auVar27._0_4_ + auVar26._0_4_ * auVar40._0_4_;
            auVar33._4_4_ = fVar47 * auVar27._4_4_ + auVar26._4_4_ * auVar40._4_4_;
            auVar33._8_4_ = fVar48 * auVar27._8_4_ + auVar26._8_4_ * auVar40._8_4_;
            auVar33._12_4_ = fVar49 * auVar27._12_4_ + auVar26._12_4_ * auVar40._12_4_;
            uVar17 = iVar18 + 1;
            if ((int)uVar17 < (int)uVar11) {
              psVar9 = &pBVar3[uVar17].super_RawBufferView.stride;
              auVar54 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              auVar57 = ZEXT1664(auVar55);
              auVar55._12_4_ = 0;
              auVar55._0_12_ = ZEXT412(0);
              do {
                auVar38._0_4_ = ((float)(int)uVar17 / fVar1 - fVar59) / (fVar58 - fVar59);
                auVar38._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar27 = vshufps_avx(auVar38,auVar38,0);
                fVar29 = auVar28._4_4_;
                fVar25 = auVar28._8_4_;
                fVar30 = auVar28._12_4_;
                auVar40 = vshufps_avx(ZEXT416((uint)(1.0 - auVar38._0_4_)),
                                      ZEXT416((uint)(1.0 - auVar38._0_4_)),0);
                fVar43 = auVar42._4_4_;
                fVar44 = auVar42._8_4_;
                fVar45 = auVar42._12_4_;
                auVar41._0_4_ = auVar28._0_4_ * auVar27._0_4_ + auVar42._0_4_ * auVar40._0_4_;
                auVar41._4_4_ = fVar29 * auVar27._4_4_ + fVar43 * auVar40._4_4_;
                auVar41._8_4_ = fVar25 * auVar27._8_4_ + fVar44 * auVar40._8_4_;
                auVar41._12_4_ = fVar30 * auVar27._12_4_ + fVar45 * auVar40._12_4_;
                fVar34 = auVar33._4_4_;
                fVar35 = auVar33._8_4_;
                fVar36 = auVar33._12_4_;
                fVar51 = auVar50._4_4_;
                fVar52 = auVar50._8_4_;
                fVar53 = auVar50._12_4_;
                auVar39._0_4_ = auVar33._0_4_ * auVar27._0_4_ + auVar50._0_4_ * auVar40._0_4_;
                auVar39._4_4_ = fVar34 * auVar27._4_4_ + fVar51 * auVar40._4_4_;
                auVar39._8_4_ = fVar35 * auVar27._8_4_ + fVar52 * auVar40._8_4_;
                auVar39._12_4_ = fVar36 * auVar27._12_4_ + fVar53 * auVar40._12_4_;
                pcVar13 = ((RawBufferView *)(psVar9 + -2))->ptr_ofs;
                sVar15 = *psVar9;
                auVar27 = vminps_avx(*(undefined1 (*) [16])(pcVar13 + sVar15 * uVar19),
                                     *(undefined1 (*) [16])(pcVar13 + sVar15 * uVar20));
                auVar27 = vminps_avx(auVar27,*(undefined1 (*) [16])(pcVar13 + sVar15 * uVar22));
                auVar40 = vsubps_avx(auVar27,auVar41);
                auVar27 = vmaxps_avx(*(undefined1 (*) [16])(pcVar13 + sVar15 * uVar19),
                                     *(undefined1 (*) [16])(pcVar13 + sVar15 * uVar20));
                auVar27 = vmaxps_avx(auVar27,*(undefined1 (*) [16])(pcVar13 + sVar15 * uVar22));
                auVar27 = vsubps_avx(auVar27,auVar39);
                auVar40 = vminps_avx(auVar40,auVar55 << 0x20);
                auVar27 = vmaxps_avx(auVar27,auVar55 << 0x20);
                auVar42._0_4_ = auVar42._0_4_ + auVar40._0_4_;
                auVar42._4_4_ = fVar43 + auVar40._4_4_;
                auVar42._8_4_ = fVar44 + auVar40._8_4_;
                auVar42._12_4_ = fVar45 + auVar40._12_4_;
                auVar28._0_4_ = auVar28._0_4_ + auVar40._0_4_;
                auVar28._4_4_ = fVar29 + auVar40._4_4_;
                auVar28._8_4_ = fVar25 + auVar40._8_4_;
                auVar28._12_4_ = fVar30 + auVar40._12_4_;
                auVar50._0_4_ = auVar50._0_4_ + auVar27._0_4_;
                auVar50._4_4_ = fVar51 + auVar27._4_4_;
                auVar50._8_4_ = fVar52 + auVar27._8_4_;
                auVar50._12_4_ = fVar53 + auVar27._12_4_;
                auVar33._0_4_ = auVar33._0_4_ + auVar27._0_4_;
                auVar33._4_4_ = fVar34 + auVar27._4_4_;
                auVar33._8_4_ = fVar35 + auVar27._8_4_;
                auVar33._12_4_ = fVar36 + auVar27._12_4_;
                uVar17 = uVar17 + 1;
                psVar9 = psVar9 + 7;
              } while (uVar11 != uVar17);
            }
            else {
              auVar54 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              auVar57 = ZEXT1664(auVar55);
            }
          }
        }
        if (bVar4) {
          auVar27 = vminps_avx(auVar42,auVar28);
          aVar5 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                  vinsertps_avx(auVar27,ZEXT416(geomID),0x30);
          auVar27 = vmaxps_avx(auVar50,auVar33);
          aVar6 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                  vinsertps_avx(auVar27,ZEXT416((uint)uVar10),0x30);
          auVar27 = vminps_avx(auVar57._0_16_,(undefined1  [16])aVar5);
          auVar57 = ZEXT1664(auVar27);
          local_78 = vmaxps_avx(local_78,(undefined1  [16])aVar6);
          auVar37._0_4_ = aVar5.x + aVar6.x;
          auVar37._4_4_ = aVar5.y + aVar6.y;
          auVar37._8_4_ = aVar5.z + aVar6.z;
          auVar37._12_4_ = aVar5.field_3.w + aVar6.field_3.w;
          local_88 = vminps_avx(local_88,auVar37);
          local_98 = vmaxps_avx(local_98,auVar37);
          local_b8 = local_b8 + 1;
          prims[local_b0].lower.field_0.field_1 = aVar5;
          prims[local_b0].upper.field_0.field_1 = aVar6;
          local_b0 = local_b0 + 1;
        }
        aVar56 = auVar57._0_16_;
        uVar10 = uVar10 + 1;
      } while (uVar10 < r->_end);
    }
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0
         = aVar56;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
      field_0 = local_78._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             upper.field_0 + 8) = local_78._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
      field_0 = local_88._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
             lower.field_0 + 8) = local_88._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
      field_0 = local_98._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
             upper.field_0 + 8) = local_98._8_8_;
    __return_storage_ptr__->end = local_b8;
  }
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArrayMB(PrimRef* prims, const BBox1f& time_range, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        const BBox1f t0t1 = BBox1f::intersect(getTimeRange(), time_range);
        if (t0t1.empty()) return pinfo;
        
        for (size_t j = r.begin(); j < r.end(); j++) {
          LBBox3fa lbounds = empty;
          if (!linearBounds(j, t0t1, lbounds))
            continue;
          const PrimRef prim(lbounds.bounds(), geomID, unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }